

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O3

float cnn::TensorTools::AccessElement(Tensor *v,int index)

{
  return v->v[index];
}

Assistant:

float TensorTools::AccessElement(const Tensor& v, int index) {
#if HAVE_CUDA
  float ret;
  cudaMemcpyAsync(&ret, &v.v[index], sizeof(real), cudaMemcpyDeviceToHost);
  return ret;
#else
  return v.v[index];
#endif
}